

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall
AbstractModuleClient::AbstractModuleClient
          (AbstractModuleClient *this,string *id,string *addr,int port)

{
  bool bVar1;
  MlmWrap *in_RDI;
  char *in_stack_00000078;
  MlmWrap *in_stack_00000080;
  AbstractModuleClient *this_00;
  allocator local_1d [29];
  
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  MlmWrap::MlmWrap(in_stack_00000080,in_stack_00000078,(char *)this,id._4_4_);
  in_RDI->_vptr_MlmWrap = (_func_int **)&PTR__AbstractModuleClient_00375038;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1bbb81);
  in_RDI[1].client = (mlm_client_t *)0x0;
  this_00 = (AbstractModuleClient *)&in_RDI[1].reactor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  *(undefined4 *)&in_RDI[1].hardwaresock = 0;
  *(undefined8 *)&in_RDI[1].trackers._M_t._M_impl = 0;
  std::mutex::mutex((mutex *)0x1bbbf3);
  bVar1 = MlmWrap::isConnectedToBroker(in_RDI);
  if (bVar1) {
    initializeStreams(this_00);
  }
  return;
}

Assistant:

AbstractModuleClient::AbstractModuleClient(std::string id, std::string addr, int port)
    : MlmWrap(id.c_str(), addr.c_str(), port), timestampsub(NULL), timestampaddress("") {
    if (isConnectedToBroker()){
        initializeStreams();
    }
}